

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O2

void ggml_opt_result_reset(ggml_opt_result_t result)

{
  pointer pfVar1;
  pointer piVar2;
  
  result->ndata = 0;
  pfVar1 = (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar1;
  }
  piVar2 = (result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  result->ncorrect = 0;
  return;
}

Assistant:

void ggml_opt_result_reset(ggml_opt_result_t result) {
    result->ndata = 0;
    result->loss.clear();
    result->pred.clear();
    result->ncorrect = 0;
}